

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm,bool last_connection)

{
  pointer ppVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  _Any_data *p_Var3;
  bool bVar4;
  int iVar5;
  Handlers *handlers;
  function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>
  *pfVar6;
  pointer ppVar7;
  _Any_data *p_Var8;
  _Any_data *p_Var9;
  ContentReader reader;
  bool local_181;
  Response *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_130;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  _Any_data local_f0;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  _Any_data local_b0;
  code *local_a0;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_181 = last_connection;
  iVar5 = std::__cxx11::string::compare((char *)req);
  if ((iVar5 == 0) && (bVar4 = handle_file_request(this,req,res), bVar4)) {
    return true;
  }
  iVar5 = std::__cxx11::string::compare((char *)req);
  if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) ||
      (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) {
    local_178._8_8_ = 0;
    local_178._M_unused._M_object = operator_new(0x28);
    *(Server **)local_178._M_unused._0_8_ = this;
    *(Stream **)((long)local_178._M_unused._0_8_ + 8) = strm;
    *(bool **)((long)local_178._M_unused._0_8_ + 0x10) = &local_181;
    *(Request **)((long)local_178._M_unused._0_8_ + 0x18) = req;
    *(Response **)((long)local_178._M_unused._0_8_ + 0x20) = res;
    local_160 = std::
                _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3298:11)>
                ::_M_invoke;
    local_168 = std::
                _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3298:11)>
                ::_M_manager;
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = operator_new(0x28);
    *(Server **)local_158._M_unused._0_8_ = this;
    *(Stream **)((long)local_158._M_unused._0_8_ + 8) = strm;
    *(bool **)((long)local_158._M_unused._0_8_ + 0x10) = &local_181;
    *(Request **)((long)local_158._M_unused._0_8_ + 0x18) = req;
    *(Response **)((long)local_158._M_unused._0_8_ + 0x20) = res;
    pcStack_140 = std::
                  _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3302:11)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3302:11)>
                ::_M_manager;
    ContentReader::ContentReader
              ((ContentReader *)&local_130,(Reader *)&local_178,(MultipartReader *)&local_158);
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,__destroy_functor);
    }
    iVar5 = std::__cxx11::string::compare((char *)req);
    local_180 = res;
    if (iVar5 == 0) {
      std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::function
                ((function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_70,
                 (function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_130);
      std::
      function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
      ::function((function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                  *)&local_50,
                 (function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                  *)&local_110);
      ppVar7 = (this->post_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->post_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar7 != ppVar1) {
        pfVar6 = &ppVar7->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar6 + -0x20),0);
          if (bVar4) {
            if (*(long *)(pfVar6 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar4 = true;
            (**(code **)(pfVar6 + 0x18))(pfVar6,req,local_180,&local_70);
            goto LAB_00122dc6;
          }
          ppVar7 = (pointer)(pfVar6 + 0x20);
          pfVar6 = pfVar6 + 0x40;
        } while (ppVar7 != ppVar1);
      }
      bVar4 = false;
LAB_00122dc6:
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
LAB_00122ed3:
      if (!bVar4) goto LAB_00122edc;
      bVar4 = false;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)req);
      if (iVar5 == 0) {
        std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::function
                  ((function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_b0,
                   (function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_130)
        ;
        std::
        function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
        ::function((function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                    *)&local_90,
                   (function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                    *)&local_110);
        ppVar7 = (this->put_handlers_for_content_reader_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = (this->put_handlers_for_content_reader_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar7 != ppVar1) {
          pfVar6 = &ppVar7->second;
          do {
            _Var2._M_current = (req->path)._M_dataplus._M_p;
            bVar4 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var2._M_current + (req->path)._M_string_length),
                               &req->matches,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               (pfVar6 + -0x20),0);
            if (bVar4) {
              if (*(long *)(pfVar6 + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              bVar4 = true;
              (**(code **)(pfVar6 + 0x18))(pfVar6,req,local_180,&local_b0);
              goto LAB_00122e31;
            }
            ppVar7 = (pointer)(pfVar6 + 0x20);
            pfVar6 = pfVar6 + 0x40;
          } while (ppVar7 != ppVar1);
        }
        bVar4 = false;
LAB_00122e31:
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        if (local_a0 != (code *)0x0) {
          (*local_a0)(&local_b0,&local_b0,__destroy_functor);
        }
        goto LAB_00122ed3;
      }
      iVar5 = std::__cxx11::string::compare((char *)req);
      if (iVar5 == 0) {
        std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::function
                  ((function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_f0,
                   (function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)> *)&local_130)
        ;
        std::
        function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
        ::function((function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                    *)&local_d0,
                   (function<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>)>
                    *)&local_110);
        ppVar7 = (this->patch_handlers_for_content_reader_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = (this->patch_handlers_for_content_reader_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar7 != ppVar1) {
          pfVar6 = &ppVar7->second;
          do {
            _Var2._M_current = (req->path)._M_dataplus._M_p;
            bVar4 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var2._M_current + (req->path)._M_string_length),
                               &req->matches,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               (pfVar6 + -0x20),0);
            if (bVar4) {
              if (*(long *)(pfVar6 + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              bVar4 = true;
              (**(code **)(pfVar6 + 0x18))(pfVar6,req,local_180,&local_f0);
              goto LAB_00122e95;
            }
            ppVar7 = (pointer)(pfVar6 + 0x20);
            pfVar6 = pfVar6 + 0x40;
          } while (ppVar7 != ppVar1);
        }
        bVar4 = false;
LAB_00122e95:
        if (local_c0 != (code *)0x0) {
          (*local_c0)(&local_d0,&local_d0,__destroy_functor);
        }
        if (local_e0 != (code *)0x0) {
          (*local_e0)(&local_f0,&local_f0,__destroy_functor);
        }
        goto LAB_00122ed3;
      }
LAB_00122edc:
      bVar4 = true;
    }
    if (local_100 != (code *)0x0) {
      (*local_100)(&local_110,&local_110,__destroy_functor);
    }
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    res = local_180;
    if (!bVar4) {
      return true;
    }
    bVar4 = read_content(this,strm,local_181,req,local_180);
    if (!bVar4) {
      return false;
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)req);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) {
    p_Var9 = (_Any_data *)
             (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var3 = (_Any_data *)
             (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var9 != p_Var3) {
      p_Var9 = (_Any_data *)(p_Var9->_M_pod_data + 0x20);
      do {
        _Var2._M_current = (req->path)._M_dataplus._M_p;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var2._M_current + (req->path)._M_string_length),&req->matches,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(p_Var9 + -2),0);
        if (bVar4) goto LAB_00123102;
        p_Var8 = p_Var9 + 2;
        p_Var9 = p_Var9 + 4;
      } while (p_Var8 != p_Var3);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)req);
    if (iVar5 == 0) {
      p_Var9 = (_Any_data *)
               (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Any_data *)
               (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var9 != p_Var3) {
        p_Var9 = (_Any_data *)(p_Var9->_M_pod_data + 0x20);
        while (_Var2._M_current = (req->path)._M_dataplus._M_p,
              bVar4 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )(_Var2._M_current + (req->path)._M_string_length),
                                 &req->matches,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                 (p_Var9 + -2),0), !bVar4) {
          p_Var8 = p_Var9 + 2;
          p_Var9 = p_Var9 + 4;
          if (p_Var8 == p_Var3) {
            return false;
          }
        }
        goto LAB_00123102;
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)req);
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare((char *)req);
        if (iVar5 == 0) {
          handlers = &this->delete_handlers_;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)req);
          if (iVar5 == 0) {
            handlers = &this->options_handlers_;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)req);
            if (iVar5 != 0) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
        bVar4 = dispatch_request(this,req,res,handlers);
        return bVar4;
      }
      p_Var9 = (_Any_data *)
               (this->put_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Any_data *)
               (this->put_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var9 != p_Var3) {
        p_Var9 = (_Any_data *)(p_Var9->_M_pod_data + 0x20);
        while (_Var2._M_current = (req->path)._M_dataplus._M_p,
              bVar4 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )(_Var2._M_current + (req->path)._M_string_length),
                                 &req->matches,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                 (p_Var9 + -2),0), !bVar4) {
          p_Var8 = p_Var9 + 2;
          p_Var9 = p_Var9 + 4;
          if (p_Var8 == p_Var3) {
            return false;
          }
        }
LAB_00123102:
        if (*(long *)(p_Var9 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(p_Var9->_M_pod_data + 0x18))(p_Var9,req,res);
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm,
                            bool last_connection) {
  // File handler
  if (req.method == "GET" && handle_file_request(req, res)) { return true; }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, last_connection, req, res, receiver, nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, last_connection, req, res, nullptr, header, receiver);
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, reader, post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, reader, put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, reader, patch_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, last_connection, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}